

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,char **arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  pointer pcVar1;
  size_type sVar2;
  char *__s;
  string_view format_00;
  string_view data;
  char *local_a0;
  size_t local_98;
  char local_90;
  undefined7 uStack_8f;
  Output *local_80;
  size_type local_78;
  pointer local_70;
  size_t local_68;
  char *local_60;
  size_type local_58;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  
  format_00._M_len = format._M_str;
  pcVar1 = (arg->_M_dataplus)._M_p;
  sVar2 = arg->_M_string_length;
  __s = *arg_1;
  local_80 = this;
  if (__s == (char *)0x0) {
    local_68 = 0;
    __s = (char *)0x0;
  }
  else {
    local_68 = strlen(__s);
  }
  local_50 = (arg_2->_M_dataplus)._M_p;
  local_58 = arg_2->_M_string_length;
  local_40 = (arg_3->_M_dataplus)._M_p;
  local_48 = arg_3->_M_string_length;
  local_98 = 0;
  local_90 = '\0';
  format_00._M_str = (char *)&local_78;
  local_a0 = &local_90;
  local_78 = sVar2;
  local_70 = pcVar1;
  local_60 = __s;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_a0,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x4,(size_t)local_50);
  data._M_str = local_a0;
  data._M_len = local_98;
  Write(local_80,data);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }